

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5efc::TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents::
~TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents
          (TestCheckCloseFailureBecauseOfExceptionIncludesCheckContents *this)

{
  UnitTest::Test::~Test(&this->super_Test);
  operator_delete(this,0x38);
  return;
}

Assistant:

TEST(CheckCloseFailureBecauseOfExceptionIncludesCheckContents)
{
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		ScopedCurrentTest scopedResults(testResults);
        CHECK_CLOSE ((float)ThrowingFunction(), 1.0001f, 0.1f);
    }

    CHECK(strstr(reporter.lastFailedMessage, "(float)ThrowingFunction()"));
    CHECK(strstr(reporter.lastFailedMessage, "1.0001f"));
}